

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chariter.cpp
# Opt level: O0

void __thiscall
icu_63::CharacterIterator::CharacterIterator
          (CharacterIterator *this,int32_t length,int32_t position)

{
  int32_t position_local;
  int32_t length_local;
  CharacterIterator *this_local;
  
  ForwardCharacterIterator::ForwardCharacterIterator(&this->super_ForwardCharacterIterator);
  (this->super_ForwardCharacterIterator).super_UObject._vptr_UObject =
       (_func_int **)&PTR__CharacterIterator_004aaa38;
  this->textLength = length;
  this->pos = position;
  this->begin = 0;
  this->end = length;
  if (this->textLength < 0) {
    this->end = 0;
    this->textLength = 0;
  }
  if (this->pos < 0) {
    this->pos = 0;
  }
  else if (this->end < this->pos) {
    this->pos = this->end;
  }
  return;
}

Assistant:

CharacterIterator::CharacterIterator(int32_t length, int32_t position)
: textLength(length), pos(position), begin(0), end(length) {
    if(textLength < 0) {
        textLength = end = 0;
    }
    if(pos < 0) {
        pos = 0;
    } else if(pos > end) {
        pos = end;
    }
}